

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int jsondec_epochdays(int y,int m,int d)

{
  int iVar1;
  uint uVar2;
  uint32_t leap_days;
  uint32_t month_days;
  uint32_t y_adj;
  uint32_t adjust;
  uint32_t carry;
  uint32_t m_adj;
  uint32_t year_base;
  int d_local;
  int m_local;
  int y_local;
  
  uVar2 = (uint)((uint)m < m - 3U);
  iVar1 = 0;
  if (uVar2 != 0) {
    iVar1 = 0xc;
  }
  uVar2 = (y + 0x12c0) - uVar2;
  return uVar2 * 0x16d + ((uVar2 >> 2) - uVar2 / 100) + uVar2 / 400 +
         (((m - 3U) + iVar1) * 0xf4ff + 0x301 >> 0xb) + d + -0x25bab9;
}

Assistant:

int jsondec_epochdays(int y, int m, int d) {
  const uint32_t year_base = 4800; /* Before min year, multiple of 400. */
  const uint32_t m_adj = m - 3;    /* March-based month. */
  const uint32_t carry = m_adj > (uint32_t)m ? 1 : 0;
  const uint32_t adjust = carry ? 12 : 0;
  const uint32_t y_adj = y + year_base - carry;
  const uint32_t month_days = ((m_adj + adjust) * 62719 + 769) / 2048;
  const uint32_t leap_days = y_adj / 4 - y_adj / 100 + y_adj / 400;
  return y_adj * 365 + leap_days + month_days + (d - 1) - 2472632;
}